

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O1

optional<tinyusdz::Path> * __thiscall
tinyusdz::usdc::USDCReader::Impl::GetElemPath
          (optional<tinyusdz::Path> *__return_storage_ptr__,Impl *this,Index index)

{
  pointer pPVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)index.value;
  pPVar1 = (this->_elemPaths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->_elemPaths).
                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pPVar1 >> 4) * 0x4ec4ec4ec4ec4ec5;
  if (uVar3 < uVar2 || uVar3 - uVar2 == 0) {
    __return_storage_ptr__->has_value_ = false;
    memset(&__return_storage_ptr__->contained,0,0xd0);
  }
  else {
    __return_storage_ptr__->has_value_ = true;
    Path::Path((Path *)&__return_storage_ptr__->contained,pPVar1 + uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<Path> GetElemPath(crate::Index index) const {
    if (index.value < _elemPaths.size()) {
      return _elemPaths[index.value];
    }

    return nonstd::nullopt;
  }